

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O3

void reportLine(ostream *os,bool ret,string *line,bool eol)

{
  long lVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  if ((int)CONCAT71(in_register_00000031,ret) == 0) {
    pcVar2 = "EOF";
    lVar1 = 3;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    os = std::__ostream_insert<char,std::char_traits<char>>
                   (os,(line->_M_dataplus)._M_p,line->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\" (",3);
    pcVar2 = "without EOL";
    if (eol) {
      pcVar2 = "with EOL";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,(ulong)!eol * 3 + 8);
    pcVar2 = ")";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return;
}

Assistant:

void reportLine(std::ostream& os, bool ret, std::string line, bool eol)
{
  if(ret)
    {
    os << "\"" << line << "\" (" << (eol?"with EOL":"without EOL") << ")";
    }
  else
    {
    os << "EOF";
    }
}